

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall r_code::SysObject::trace(SysObject *this)

{
  vector<r_code::SysView_*> *this_00;
  ostream *poVar1;
  Atom *pAVar2;
  SysView **ppSVar3;
  size_t sVar4;
  size_t sVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n---object---\n",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"code size: ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"reference set size: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"marker set size: ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"view set size: ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n---code---\n",0xc);
  if ((this->super_ImageObject).code.m_vector.
      super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_ImageObject).code.m_vector.
      super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar4 = 0;
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      pAVar2 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,sVar4);
      Atom::trace(pAVar2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
      sVar4 = sVar4 + 1;
    } while (sVar4 < (ulong)((long)(this->super_ImageObject).code.m_vector.
                                   super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->super_ImageObject).code.m_vector.
                                   super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n---reference set---\n",0x15);
  if ((this->super_ImageObject).references.m_vector.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_ImageObject).references.m_vector.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar4 = 0;
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      vector<unsigned_int>::operator[](&(this->super_ImageObject).references,sVar4);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      sVar4 = sVar4 + 1;
    } while (sVar4 < (ulong)((long)(this->super_ImageObject).references.m_vector.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->super_ImageObject).references.m_vector.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n---marker set---\n",0x12);
  if ((this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    sVar4 = 0;
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      vector<unsigned_int>::operator[](&this->markers,sVar4);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      sVar4 = sVar4 + 1;
    } while (sVar4 < (ulong)((long)(this->markers).m_vector.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->markers).m_vector.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n---view set---\n",0x10);
  if ((this->views).m_vector.
      super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->views).m_vector.
      super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &this->views;
    sVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"view[",5);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"reference set size: ",0x14);
      vector<r_code::SysView_*>::operator[](this_00,sVar4);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-code-",6);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
      ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,sVar4);
      if (((*ppSVar3)->super_ImageObject).code.m_vector.
          super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          ((*ppSVar3)->super_ImageObject).code.m_vector.
          super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
          super__Vector_impl_data._M_start) {
        sVar5 = 0;
        do {
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,sVar4);
          pAVar2 = vector<r_code::Atom>::operator[](&((*ppSVar3)->super_ImageObject).code,sVar5);
          Atom::trace(pAVar2);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          std::ostream::flush();
          sVar5 = sVar5 + 1;
          ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,sVar4);
        } while (sVar5 < (ulong)((long)((*ppSVar3)->super_ImageObject).code.m_vector.
                                       super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)((*ppSVar3)->super_ImageObject).code.m_vector.
                                       super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-reference set-",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
      ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,sVar4);
      if (((*ppSVar3)->super_ImageObject).references.m_vector.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          ((*ppSVar3)->super_ImageObject).references.m_vector.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        sVar5 = 0;
        do {
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,sVar4);
          vector<unsigned_int>::operator[](&((*ppSVar3)->super_ImageObject).references,sVar5);
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          sVar5 = sVar5 + 1;
          ppSVar3 = vector<r_code::SysView_*>::operator[](this_00,sVar4);
        } while (sVar5 < (ulong)((long)((*ppSVar3)->super_ImageObject).references.m_vector.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)((*ppSVar3)->super_ImageObject).references.m_vector.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 < (ulong)((long)(this->views).m_vector.
                                   super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->views).m_vector.
                                   super__Vector_base<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void SysObject::trace()
{
    std::cout << "\n---object---\n";
    std::cout << oid << std::endl;
    std::cout << "code size: " << code.size() << std::endl;
    std::cout << "reference set size: " << references.size() << std::endl;
    std::cout << "marker set size: " << markers.size() << std::endl;
    std::cout << "view set size: " << views.size() << std::endl;
    std::cout << "\n---code---\n";
    size_t i;

    for (i = 0; i < code.size(); ++i) {
        std::cout << i << " ";
        code[i].trace();
        std::cout << std::endl;
    }

    std::cout << "\n---reference set---\n";

    for (i = 0; i < references.size(); ++i) {
        std::cout << i << " " << references[i] << std::endl;
    }

    std::cout << "\n---marker set---\n";

    for (i = 0; i < markers.size(); ++i) {
        std::cout << i << " " << markers[i] << std::endl;
    }

    std::cout << "\n---view set---\n";

    for (size_t k = 0; k < views.size(); ++k) {
        std::cout << "view[" << k << "]" << std::endl;
        std::cout << "reference set size: " << views[k]->references.size() << std::endl;
        std::cout << "-code-" << std::endl;
        size_t j;

        for (j = 0; j < views[k]->code.size(); ++i, ++j) {
            std::cout << j << " ";
            views[k]->code[j].trace();
            std::cout << std::endl;
        }

        std::cout << "-reference set-" << std::endl;

        for (j = 0; j < views[k]->references.size(); ++i, ++j) {
            std::cout << j << " " << views[k]->references[j] << std::endl;
        }
    }
}